

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmExportSet *pcVar1;
  pointer puVar2;
  cmTargetExport *targetExport;
  cmGeneratorTarget *target;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  int iVar9;
  ostream *poVar10;
  string *psVar11;
  pointer ppcVar12;
  cmValue cVar13;
  cmExportInstallFileGenerator *this_00;
  string *c;
  pointer puVar14;
  pointer pbVar15;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar16;
  string sep;
  string expectedTargets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  pointer local_1f8;
  pointer local_1f0;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  string local_1c8;
  string cxx_modules_name;
  
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
  expectedTargets._M_string_length = 0;
  expectedTargets.field_2._M_local_buf[0] = '\0';
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->IEGen->ExportSet;
  puVar2 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (pcVar1->TargetExports).
                 super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2; puVar14 = puVar14 + 1
      ) {
    if (((puVar14->_M_t).super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
         ._M_t.super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
         super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->NamelinkOnly == false) {
      std::operator+(&local_218,&sep,&(this->super_cmExportFileGenerator).Namespace);
      cmGeneratorTarget::GetExportName_abi_cxx11_
                (&local_1c8,
                 ((puVar14->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
      std::operator+(&cxx_modules_name,&local_218,&local_1c8);
      std::__cxx11::string::append((string *)&expectedTargets);
      std::__cxx11::string::~string((string *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::assign((char *)&sep);
      pVar16 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)&(this->super_cmExportFileGenerator).ExportedTargets,
                          &((puVar14->_M_t).
                            super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                            .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cxx_modules_name);
        poVar10 = std::operator<<((ostream *)&cxx_modules_name,"install(EXPORT \"");
        poVar10 = std::operator<<(poVar10,(string *)&this->IEGen->ExportSet->Name);
        poVar10 = std::operator<<(poVar10,"\" ...) ");
        poVar10 = std::operator<<(poVar10,"includes target \"");
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                            (((puVar14->_M_t).
                              super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                              .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target)
        ;
        poVar10 = std::operator<<(poVar10,(string *)psVar11);
        std::operator<<(poVar10,"\" more than once in the export set.");
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cxx_modules_name);
        goto LAB_004d3233;
      }
      cxx_modules_name._M_dataplus._M_p =
           (pointer)(puVar14->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::emplace_back<cmTargetExport*>
                ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&allTargets,
                 (cmTargetExport **)&cxx_modules_name);
    }
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xc])(this,os,&expectedTargets);
LAB_004d3233:
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&expectedTargets);
  if (puVar14 == puVar2) {
    this_00 = this;
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x18])(this,os);
    local_1f8 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    bVar4 = false;
    ppcVar12 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    while (ppcVar12 != local_1f8) {
      targetExport = *ppcVar12;
      target = targetExport->Target;
      local_1f0 = ppcVar12;
      TVar7 = GetExportTargetType(this_00,targetExport);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target,(ulong)TVar7);
      cxx_modules_name._M_string_length._0_4_ = 0;
      cxx_modules_name.field_2._M_allocated_capacity = 0;
      cxx_modules_name.field_2._8_8_ = &cxx_modules_name._M_string_length;
      expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
      expectedTargets._M_string_length = 0;
      expectedTargets.field_2._M_local_buf[0] = '\0';
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name,targetExport,&expectedTargets);
      cmExportFileGenerator::PopulateSourcesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",(allocator<char> *)&local_218
                );
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_COMPILE_DEFINITIONS",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_COMPILE_OPTIONS",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_PRECOMPILE_HEADERS",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_AUTOUIC_OPTIONS",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_AUTOMOC_MACRO_NAMES",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_COMPILE_FEATURES",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sep,"INTERFACE_LINK_OPTIONS",(allocator<char> *)&local_218);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      std::__cxx11::string::~string((string *)&sep);
      cmExportFileGenerator::PopulateLinkDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      cmExportFileGenerator::PopulateLinkDependsInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)&cxx_modules_name);
      sep._M_dataplus._M_p = (pointer)&sep.field_2;
      sep._M_string_length = 0;
      sep.field_2._M_local_buf[0] = '\0';
      bVar5 = cmExportFileGenerator::PopulateCxxModuleExportProperties
                        (&this->super_cmExportFileGenerator,target,
                         (ImportPropertyMap *)&cxx_modules_name,InstallInterface,&expectedTargets,
                         &sep);
      if (!bVar5) {
LAB_004d36b7:
        cmSystemTools::Error(&sep);
        std::__cxx11::string::~string((string *)&sep);
        std::__cxx11::string::~string((string *)&expectedTargets);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&cxx_modules_name);
        goto LAB_004d36e2;
      }
      bVar5 = cmExportFileGenerator::PopulateExportProperties
                        (&this->super_cmExportFileGenerator,target,
                         (ImportPropertyMap *)&cxx_modules_name,&sep);
      if (!bVar5) goto LAB_004d36b7;
      PVar8 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
      this_00 = (cmExportInstallFileGenerator *)&cxx_modules_name;
      if (PVar8 != WARN) {
        PVar8 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
        if (PVar8 != OLD) {
          bVar5 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                            (&this->super_cmExportFileGenerator,target,InstallInterface,
                             (ImportPropertyMap *)this_00);
          if ((bVar5) && ((this->super_cmExportFileGenerator).ExportOld == false)) {
            cmExportFileGenerator::SetRequiredCMakeVersion
                      (&this->super_cmExportFileGenerator,2,8,0xc);
          }
        }
      }
      if (TVar7 == INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetRequiredCMakeVersion(&this->super_cmExportFileGenerator,3,0,0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"INTERFACE_SOURCES",(allocator<char> *)&local_1c8);
      cVar13 = cmGeneratorTarget::GetProperty(target,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      if (cVar13.Value != (string *)0x0) {
        cmExportFileGenerator::SetRequiredCMakeVersion(&this->super_cmExportFileGenerator,3,1,0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"INTERFACE_POSITION_INDEPENDENT_CODE",
                 (allocator<char> *)&local_1c8);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_218,target,(ImportPropertyMap *)this_00);
      std::__cxx11::string::~string((string *)&local_218);
      cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)this_00);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,target,os,this_00);
      cmExportFileGenerator::GenerateTargetFileSets
                (&this->super_cmExportFileGenerator,target,os,targetExport);
      bVar4 = (bool)(bVar4 | TVar7 != INTERFACE_LIBRARY);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::~string((string *)&expectedTargets);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_00);
      ppcVar12 = local_1f0 + 1;
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x19])(this,os);
    std::__cxx11::string::string
              ((string *)&cxx_modules_name,(string *)&this->IEGen->ExportSet->Name);
    cmExportFileGenerator::GenerateCxxModuleInformation
              (&this->super_cmExportFileGenerator,&cxx_modules_name,os);
    bVar5 = true;
    if (bVar4) {
      pbVar3 = (this->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = true;
      for (pbVar15 = (this->super_cmExportFileGenerator).Configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar3;
          pbVar15 = pbVar15 + 1) {
        bVar6 = GenerateImportCxxModuleConfigTargetInclusion(this,&cxx_modules_name,pbVar15);
        bVar5 = (bool)(bVar5 & bVar6);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1a])(this,os);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
    if (bVar4) {
      pbVar3 = (this->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar15 = (this->super_cmExportFileGenerator).Configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar3;
          pbVar15 = pbVar15 + 1) {
        iVar9 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1b])
                          (this,pbVar15);
        bVar5 = (bool)(bVar5 & (byte)iVar9);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os);
    std::__cxx11::string::~string((string *)&cxx_modules_name);
  }
  else {
LAB_004d36e2:
    bVar5 = false;
  }
  std::_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~_Vector_base
            (&allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>);
  return bVar5;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::unique_ptr<cmTargetExport> const& te :
         this->IEGen->GetExportSet()->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te.get());
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    std::string includesDestinationDirs;
    this->PopulateIncludeDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties, *te,
      includesDestinationDirs);
    this->PopulateSourcesInterface(gt, cmGeneratorExpression::InstallInterface,
                                   properties);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOMOC_MACRO_NAMES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateLinkDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);
    this->PopulateLinkDependsInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);

    std::string errorMessage;
    if (!this->PopulateCxxModuleExportProperties(
          gt, properties, cmGeneratorExpression::InstallInterface,
          includesDestinationDirs, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties) &&
          !this->ExportOld) {
        this->SetRequiredCMakeVersion(2, 8, 12);
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      this->SetRequiredCMakeVersion(3, 0, 0);
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      this->SetRequiredCMakeVersion(3, 1, 0);
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);

    this->GenerateTargetFileSets(gt, os, te);
  }

  this->LoadConfigFiles(os);

  bool result = true;

  std::string cxx_modules_name = this->IEGen->GetExportSet()->GetName();
  this->GenerateCxxModuleInformation(cxx_modules_name, os);
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportCxxModuleConfigTargetInclusion(cxx_modules_name,
                                                              c)) {
        result = false;
      }
    }
  }

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os);

  return result;
}